

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::NetAliasVisitor&>
          (AssertionInstanceExpression *this,NetAliasVisitor *visitor)

{
  pointer ppSVar1;
  size_t sVar2;
  DeclaredType *this_00;
  Expression *this_01;
  long lVar3;
  
  ppSVar1 = (this->localVars)._M_ptr;
  sVar2 = (this->localVars)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = Symbol::getDeclaredType(*(Symbol **)((long)ppSVar1 + lVar3));
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visit<slang::ast::NetAliasVisitor&>(this_01,visitor);
    }
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }